

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tostring.cc
# Opt level: O0

Regexp * __thiscall re2::Regexp::ToString_abi_cxx11_(Regexp *this)

{
  bool bVar1;
  Regexp *in_RSI;
  undefined1 local_40 [8];
  ToStringWalker w;
  Regexp *this_local;
  string *t;
  
  w.t_._7_1_ = 0;
  std::__cxx11::string::string((string *)this);
  ToStringWalker::ToStringWalker((ToStringWalker *)local_40,(string *)this);
  Walker<int>::WalkExponential((Walker<int> *)local_40,in_RSI,6,100000);
  bVar1 = Walker<int>::stopped_early((Walker<int> *)local_40);
  if (bVar1) {
    std::__cxx11::string::operator+=((string *)this," [truncated]");
  }
  w.t_._7_1_ = 1;
  ToStringWalker::~ToStringWalker((ToStringWalker *)local_40);
  if ((w.t_._7_1_ & 1) == 0) {
    std::__cxx11::string::~string((string *)this);
  }
  return this;
}

Assistant:

string Regexp::ToString() {
  string t;
  ToStringWalker w(&t);
  w.WalkExponential(this, PrecToplevel, 100000);
  if (w.stopped_early())
    t += " [truncated]";
  return t;
}